

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.cc
# Opt level: O3

bool __thiscall
testing::internal::UntypedFunctionMockerBase::VerifyAndClearExpectationsLocked
          (UntypedFunctionMockerBase *this)

{
  uint uVar1;
  ExpectationBase *this_00;
  CardinalityInterface *pCVar2;
  char *pcVar3;
  linked_ptr<testing::internal::ExpectationBase> *plVar4;
  bool bVar5;
  int iVar6;
  size_t sVar7;
  FailureReporterInterface *pFVar8;
  linked_ptr<testing::internal::ExpectationBase> *this_01;
  linked_ptr<testing::internal::ExpectationBase> *plVar9;
  bool bVar10;
  linked_ptr<testing::internal::ExpectationBase> *plVar11;
  stringstream ss;
  undefined1 *local_1d8 [2];
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [16];
  pointer local_1a8;
  ios_base local_138 [264];
  
  MutexBase::AssertHeld((MutexBase *)g_gmock_mutex);
  plVar9 = (this->untyped_expectations_).
           super__Vector_base<testing::internal::linked_ptr<testing::internal::ExpectationBase>,_std::allocator<testing::internal::linked_ptr<testing::internal::ExpectationBase>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  plVar11 = (this->untyped_expectations_).
            super__Vector_base<testing::internal::linked_ptr<testing::internal::ExpectationBase>,_std::allocator<testing::internal::linked_ptr<testing::internal::ExpectationBase>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (plVar9 == plVar11) {
    bVar10 = true;
  }
  else {
    bVar10 = true;
    do {
      this_00 = plVar9->value_;
      bVar5 = ExpectationBase::IsOverSaturated(this_00);
      if (bVar5) {
LAB_0012ed7d:
        bVar10 = false;
      }
      else {
        MutexBase::AssertHeld((MutexBase *)g_gmock_mutex);
        pCVar2 = (this_00->cardinality_).impl_.value_;
        iVar6 = (*pCVar2->_vptr_CardinalityInterface[4])(pCVar2,(ulong)(uint)this_00->call_count_);
        if ((char)iVar6 == '\0') {
          std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1a8,"Actual function call count doesn\'t match ",0x29);
          pcVar3 = (this_00->source_text_)._M_dataplus._M_p;
          if (pcVar3 == (char *)0x0) {
            std::ios::clear((int)(ostream *)&local_1a8 + (int)local_1a8[-2].link_.next_);
          }
          else {
            sVar7 = strlen(pcVar3);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,pcVar3,sVar7);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"...\n",4);
          (*this_00->_vptr_ExpectationBase[2])(this_00,(ostream *)&local_1a8);
          ExpectationBase::DescribeCallCountTo(this_00,(ostream *)&local_1a8);
          pcVar3 = this_00->file_;
          uVar1 = this_00->line_;
          std::__cxx11::stringbuf::str();
          pFVar8 = GetFailureReporter();
          (*pFVar8->_vptr_FailureReporterInterface[2])(pFVar8,0,pcVar3,(ulong)uVar1,local_1d8);
          if (local_1d8[0] != local_1c8) {
            operator_delete(local_1d8[0]);
          }
          std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
          std::ios_base::~ios_base(local_138);
          goto LAB_0012ed7d;
        }
      }
      plVar9 = plVar9 + 1;
      plVar11 = (this->untyped_expectations_).
                super__Vector_base<testing::internal::linked_ptr<testing::internal::ExpectationBase>,_std::allocator<testing::internal::linked_ptr<testing::internal::ExpectationBase>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    } while (plVar9 != plVar11);
    plVar9 = (this->untyped_expectations_).
             super__Vector_base<testing::internal::linked_ptr<testing::internal::ExpectationBase>,_std::allocator<testing::internal::linked_ptr<testing::internal::ExpectationBase>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
  }
  local_1a8 = (this->untyped_expectations_).
              super__Vector_base<testing::internal::linked_ptr<testing::internal::ExpectationBase>,_std::allocator<testing::internal::linked_ptr<testing::internal::ExpectationBase>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->untyped_expectations_).
  super__Vector_base<testing::internal::linked_ptr<testing::internal::ExpectationBase>,_std::allocator<testing::internal::linked_ptr<testing::internal::ExpectationBase>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->untyped_expectations_).
  super__Vector_base<testing::internal::linked_ptr<testing::internal::ExpectationBase>,_std::allocator<testing::internal::linked_ptr<testing::internal::ExpectationBase>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->untyped_expectations_).
  super__Vector_base<testing::internal::linked_ptr<testing::internal::ExpectationBase>,_std::allocator<testing::internal::linked_ptr<testing::internal::ExpectationBase>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1b8._0_8_ = plVar9;
  local_1b8._8_8_ = plVar11;
  MutexBase::Unlock((MutexBase *)g_gmock_mutex);
  plVar4 = (linked_ptr<testing::internal::ExpectationBase> *)local_1b8._8_8_;
  for (this_01 = plVar9; plVar11 != this_01; this_01 = this_01 + 1) {
    linked_ptr<testing::internal::ExpectationBase>::~linked_ptr(this_01);
    plVar4 = plVar9;
  }
  local_1b8._8_8_ = plVar4;
  MutexBase::Lock((MutexBase *)g_gmock_mutex);
  std::
  vector<testing::internal::linked_ptr<testing::internal::ExpectationBase>,_std::allocator<testing::internal::linked_ptr<testing::internal::ExpectationBase>_>_>
  ::~vector((vector<testing::internal::linked_ptr<testing::internal::ExpectationBase>,_std::allocator<testing::internal::linked_ptr<testing::internal::ExpectationBase>_>_>
             *)local_1b8);
  return bVar10;
}

Assistant:

GTEST_EXCLUSIVE_LOCK_REQUIRED_(g_gmock_mutex) {
  g_gmock_mutex.AssertHeld();
  bool expectations_met = true;
  for (UntypedExpectations::const_iterator it =
           untyped_expectations_.begin();
       it != untyped_expectations_.end(); ++it) {
    ExpectationBase* const untyped_expectation = it->get();
    if (untyped_expectation->IsOverSaturated()) {
      // There was an upper-bound violation.  Since the error was
      // already reported when it occurred, there is no need to do
      // anything here.
      expectations_met = false;
    } else if (!untyped_expectation->IsSatisfied()) {
      expectations_met = false;
      ::std::stringstream ss;
      ss  << "Actual function call count doesn't match "
          << untyped_expectation->source_text() << "...\n";
      // No need to show the source file location of the expectation
      // in the description, as the Expect() call that follows already
      // takes care of it.
      untyped_expectation->MaybeDescribeExtraMatcherTo(&ss);
      untyped_expectation->DescribeCallCountTo(&ss);
      Expect(false, untyped_expectation->file(),
             untyped_expectation->line(), ss.str());
    }
  }

  // Deleting our expectations may trigger other mock objects to be deleted, for
  // example if an action contains a reference counted smart pointer to that
  // mock object, and that is the last reference. So if we delete our
  // expectations within the context of the global mutex we may deadlock when
  // this method is called again. Instead, make a copy of the set of
  // expectations to delete, clear our set within the mutex, and then clear the
  // copied set outside of it.
  UntypedExpectations expectations_to_delete;
  untyped_expectations_.swap(expectations_to_delete);

  g_gmock_mutex.Unlock();
  expectations_to_delete.clear();
  g_gmock_mutex.Lock();

  return expectations_met;
}